

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O2

bool __thiscall cmCTestP4::UpdateCustom(cmCTestP4 *this,string *custom)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  p4_custom;
  cmList p4_custom_command;
  OutputLogger custom_err;
  OutputLogger custom_out;
  
  cmList::cmList(&p4_custom_command,custom,Yes);
  p4_custom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  p4_custom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p4_custom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&p4_custom,
            (long)p4_custom_command.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)p4_custom_command.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5);
  ::cm::
  append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_cmList,_0>
            (&p4_custom,&p4_custom_command);
  cmProcessTools::OutputLogger::OutputLogger
            (&custom_out,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"p4_customsync-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&custom_err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"p4_customsync-err> ");
  bVar1 = cmCTestVC::RunUpdateCommand
                    ((cmCTestVC *)this,&p4_custom,(OutputParser *)&custom_out,
                     (OutputParser *)&custom_err,Auto);
  cmProcessTools::LineParser::~LineParser(&custom_err.super_LineParser);
  cmProcessTools::LineParser::~LineParser(&custom_out.super_LineParser);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&p4_custom);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&p4_custom_command.Values);
  return bVar1;
}

Assistant:

bool cmCTestP4::UpdateCustom(const std::string& custom)
{
  cmList p4_custom_command{ custom, cmList::EmptyElements::Yes };

  std::vector<std::string> p4_custom;
  p4_custom.reserve(p4_custom_command.size());
  cm::append(p4_custom, p4_custom_command);

  OutputLogger custom_out(this->Log, "p4_customsync-out> ");
  OutputLogger custom_err(this->Log, "p4_customsync-err> ");

  return this->RunUpdateCommand(p4_custom, &custom_out, &custom_err);
}